

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_symbol_for(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValue JVar2;
  JSValue str;
  JSValueUnion p;
  JSValue in_stack_ffffffffffffffa8;
  JSContext *ctx_00;
  undefined1 local_10 [16];
  
  JVar2 = JS_ToString((JSContext *)0x1be462,in_stack_ffffffffffffffa8);
  p = JVar2.u;
  ctx_00 = (JSContext *)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    local_10 = (undefined1  [16])JS_NewSymbol(ctx_00,(JSString *)p.ptr,JVar2.tag._4_4_);
  }
  else {
    local_10._0_8_ = local_10._4_8_ << 0x20;
    local_10._8_8_ = 6;
  }
  JVar2.u = (JSValueUnion)local_10._0_8_;
  JVar2.tag = local_10._8_8_;
  return JVar2;
}

Assistant:

static JSValue js_symbol_for(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSValue str;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return JS_EXCEPTION;
    return JS_NewSymbol(ctx, JS_VALUE_GET_STRING(str), JS_ATOM_TYPE_GLOBAL_SYMBOL);
}